

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O2

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::clear
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  CLI::std::mutex::lock((mutex *)&this->m_pullLock);
  CLI::std::mutex::lock((mutex *)this);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pullElements);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
            (&this->pushElements);
  LOCK();
  (this->queueEmptyFlag)._M_base._M_i = true;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_pullLock);
  return;
}

Assistant:

void clear()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            std::lock_guard<MUTEX> pushLock(m_pushLock);  // second pushLock
            pullElements.clear();
            pushElements.clear();
            queueEmptyFlag = true;
        }